

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O3

int main(int argc,char **argv)

{
  rnnvalue *prVar1;
  int iVar2;
  rnndb *db;
  rnndeccontext *ctx;
  long lVar3;
  ulonglong addr;
  rnnenum *prVar4;
  rnndomain *domain;
  rnndecaddrinfo *prVar5;
  rnnbitset *prVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  char *variant;
  char local_59;
  char *local_58;
  char *local_40;
  long local_38;
  
  local_40 = (char *)0x0;
  rnn_init();
  if (argc < 2) {
switchD_0010247a_default:
    puts(
        "Usage:\n\tlookup [-f file.xml] [-a NVXX] -e enum-name [-- -v attribute value] value\n\tlookup [-f file.xml] [-a NVXX] -b bitset-name [-- -v attribute value] value\n\tlookup [-f file.xml] [-a NVXX] [-d domain-name] [-- -v attribute value] address\n\tlookup [-f file.xml] [-a NVXX] [-d domain-name] [-- -v attribute value] address value"
        );
    exit(2);
  }
  bVar10 = false;
  db = rnn_newdb();
  iVar2 = getopt(argc,argv,"f:a:d:e:b:c");
  iVar2 = iVar2 << 0x18;
  if (iVar2 == -0x1000000) {
    local_58 = "nv_mmio.xml";
    pcVar9 = "NV_MMIO";
    local_59 = 'd';
  }
  else {
    local_38 = 1;
    local_59 = 'd';
    pcVar9 = "NV_MMIO";
    local_58 = "nv_mmio.xml";
    do {
      pcVar8 = _optarg;
      switch(iVar2 >> 0x18) {
      case 0x61:
        iVar2 = strncasecmp(_optarg,"NV",2);
        if (iVar2 == 0) {
          local_40 = strdup(pcVar8);
        }
        else {
          asprintf(&local_40,"NV%s",pcVar8);
        }
        break;
      case 0x62:
        pcVar9 = strdup(_optarg);
        local_59 = 'b';
        break;
      case 99:
        local_38 = 0;
        break;
      case 100:
        pcVar9 = strdup(_optarg);
        local_59 = 'd';
        break;
      case 0x65:
        pcVar9 = strdup(_optarg);
        local_59 = 'e';
        break;
      case 0x66:
        local_58 = strdup(_optarg);
        break;
      default:
        goto switchD_0010247a_default;
      }
      iVar2 = getopt(argc,argv,"f:a:d:e:b:c");
      iVar2 = iVar2 << 0x18;
    } while (iVar2 != -0x1000000);
    bVar10 = local_38 == 0;
  }
  rnn_parsefile(db,local_58);
  rnn_prepdb(db);
  ctx = rnndec_newcontext(db);
  if (!bVar10) {
    ctx->colors = &rnndec_colorsterm;
  }
  if (local_40 != (char *)0x0) {
    rnndec_varadd(ctx,"chipset",local_40);
  }
  lVar3 = (long)_optind;
  pcVar8 = argv[lVar3];
  iVar2 = _optind;
  if (*pcVar8 == '-') {
    ppcVar7 = argv + lVar3;
    do {
      iVar2 = (int)lVar3;
      if ((pcVar8[1] != 'v') || (pcVar8[2] != '\0')) break;
      rnndec_varadd(ctx,ppcVar7[1],ppcVar7[2]);
      lVar3 = (long)_optind + 3;
      iVar2 = (int)lVar3;
      ppcVar7 = argv + (long)_optind + 3;
      pcVar8 = *ppcVar7;
      _optind = iVar2;
    } while (*pcVar8 == '-');
  }
  if (argc <= iVar2) {
    main_cold_1();
    return 1;
  }
  local_58 = (char *)0x0;
  addr = strtoull(pcVar8,(char **)0x0,0x10);
  if (_optind + 1 < argc) {
    local_58 = (char *)strtoull(argv[(long)_optind + 1],(char **)0x0,0x10);
  }
  if (local_59 == 'b') {
    prVar6 = rnn_findbitset(db,pcVar9);
    if (prVar6 != (rnnbitset *)0x0) {
      pcVar9 = "TODO";
LAB_0010270c:
      puts(pcVar9);
      return 0;
    }
    pcVar8 = "Not a bitset: \'%s\'\n";
  }
  else if (local_59 == 'd') {
    domain = rnn_finddomain(db,pcVar9);
    if (domain != (rnndomain *)0x0) {
      prVar5 = rnndec_decodeaddr(ctx,domain,addr,0);
      if (prVar5 == (rnndecaddrinfo *)0x0) {
        return 1;
      }
      pcVar9 = prVar5->name;
      if (prVar5->typeinfo != (rnntypeinfo *)0x0) {
        pcVar8 = rnndec_decodeval(ctx,prVar5->typeinfo,(uint64_t)local_58,prVar5->width);
        printf("%s => %s\n",pcVar9,pcVar8);
        return 0;
      }
      goto LAB_0010270c;
    }
    pcVar8 = "Not a domain: \'%s\'\n";
  }
  else {
    if (local_59 != 'e') {
      return 1;
    }
    prVar4 = rnn_findenum(db,pcVar9);
    if (prVar4 != (rnnenum *)0x0) {
      if (0 < (long)prVar4->valsnum) {
        lVar3 = 0;
        do {
          prVar1 = prVar4->vals[lVar3];
          if ((prVar1->valvalid != 0) && (prVar1->value == addr)) {
            pcVar9 = prVar1->name;
            goto LAB_0010270c;
          }
          lVar3 = lVar3 + 1;
        } while (prVar4->valsnum != lVar3);
      }
      printf("%#lx\n",addr);
      return 0;
    }
    pcVar8 = "Not an enum: \'%s\'\n";
  }
  fprintf(_stderr,pcVar8,pcVar9);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	char *file = "nv_mmio.xml";
	char *name = "NV_MMIO";
	char *variant = NULL;
	char c, mode = 'd';
	uint64_t reg, colors=1, val = 0;
	struct rnndeccontext *vc;

	rnn_init();
	if (argc < 2) {
		usage();
	}
	struct rnndb *db = rnn_newdb();

	/* Arguments parsing */
	while ((c = getopt (argc, argv, "f:a:d:e:b:c")) != -1) {
		switch (c) {
			case 'f':
				file = strdup(optarg);
				break;
			case 'e':
				mode = 'e';
				name = strdup(optarg);
				break;
			case 'b':
				mode = 'b';
				name = strdup(optarg);
				break;
			case 'd':
				mode = 'd';
				name = strdup(optarg);
				break;
			case 'a':
				if (!strncasecmp(optarg, "NV", 2))
					variant = strdup(optarg);
				else
					asprintf(&variant, "NV%s", optarg);
				break;
			case 'c':
				colors = 0;
				break;
			default: usage();
		}
	}

	rnn_parsefile (db, file);
	rnn_prepdb (db);
	vc = rnndec_newcontext(db);
	if(colors)
		vc->colors = &rnndec_colorsterm;

	if (variant)
		rnndec_varadd(vc, "chipset", variant);

	/* Parse extra arguments */
	while (!strcmp (argv[optind], "-v")) {
		rnndec_varadd(vc, argv[optind+1], argv[optind+2]);
		optind+=3;
	}

	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}

	reg = strtoull(argv[optind], 0, 16);
	if (optind + 1 < argc)
		val = strtoull(argv[optind + 1], 0, 16);

	if (mode == 'e') {
		struct rnnenum *en = rnn_findenum (db, name);
		if (en) {
			int i;
			int dec = 0;
			for (i = 0; i < en->valsnum; i++)
				if (en->vals[i]->valvalid && en->vals[i]->value == reg) {
					printf ("%s\n", en->vals[i]->name);
					dec = 1;
					break;
				}
			if (!dec)
				printf ("%#"PRIx64"\n", reg);

			return 0;
		} else {
			fprintf(stderr, "Not an enum: '%s'\n", name);
			return 1;
		}
	} else if (mode == 'b') {
		struct rnnbitset *bs = rnn_findbitset (db, name);

		if (bs) {
			printf("TODO\n");
			return 0;
		} else {
			fprintf(stderr, "Not a bitset: '%s'\n", name);
			return 1;
		}

	} else if (mode == 'd') {
		struct rnndomain *dom = rnn_finddomain (db, name);

		if (dom) {
			struct rnndecaddrinfo *info = rnndec_decodeaddr(vc, dom, reg, 0);
			if (info && info->typeinfo)
				printf ("%s => %s\n", info->name, rnndec_decodeval(vc, info->typeinfo, val, info->width));
			else if (info)
				printf ("%s\n", info->name);
			else
				return 1;
			return 0;
		} else {
			fprintf(stderr, "Not a domain: '%s'\n", name);
			return 1;
		}
	} else {
		return 1;
	}
}